

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.h
# Opt level: O2

void __thiscall ncnn::Blob::~Blob(Blob *this)

{
  int *piVar1;
  Allocator *pAVar2;
  
  piVar1 = (this->shape).refcount;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      pAVar2 = (this->shape).allocator;
      if (pAVar2 == (Allocator *)0x0) {
        free((this->shape).data);
      }
      else {
        (*pAVar2->_vptr_Allocator[3])();
      }
    }
  }
  (this->shape).cstep = 0;
  *(undefined8 *)((long)&(this->shape).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->shape).elemsize + 4) = 0;
  (this->shape).data = (void *)0x0;
  (this->shape).refcount = (int *)0x0;
  (this->shape).dims = 0;
  (this->shape).w = 0;
  (this->shape).h = 0;
  (this->shape).d = 0;
  (this->shape).c = 0;
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

class NCNN_EXPORT Blob
{
public:
    // empty
    Blob();

public:
#if NCNN_STRING
    // blob name
    std::string name;
#endif // NCNN_STRING
    // layer index which produce this blob as output
    int producer;
    // layer index which need this blob as input
    int consumer;
    // shape hint
    Mat shape;
}